

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::
emplaceRealloc<slang::ast::PrimitiveSymbol::TableEntry>
          (SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *this,pointer pos,
          TableEntry *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  pointer p;
  size_type sVar4;
  char *pcVar5;
  undefined8 uVar6;
  pointer pTVar7;
  pointer pTVar8;
  char cVar9;
  bool bVar10;
  undefined5 uVar11;
  pointer pTVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar14 = this->len + 1;
  uVar3 = this->cap;
  if (uVar14 < uVar3 * 2) {
    uVar14 = uVar3 * 2;
  }
  if (0x555555555555555 - uVar3 < uVar3) {
    uVar14 = 0x555555555555555;
  }
  lVar15 = (long)pos - (long)this->data_;
  pTVar12 = (pointer)operator_new(uVar14 * 0x18);
  *(undefined8 *)((long)pTVar12 + lVar15 + 0x10) = *(undefined8 *)&args->state;
  pcVar5 = (args->inputs)._M_str;
  *(size_t *)((long)pTVar12 + lVar15) = (args->inputs)._M_len;
  ((size_t *)((long)pTVar12 + lVar15))[1] = (size_t)pcVar5;
  p = this->data_;
  sVar4 = this->len;
  lVar13 = (long)p + (sVar4 * 0x18 - (long)pos);
  pTVar7 = p;
  pTVar8 = pTVar12;
  if (lVar13 == 0) {
    if (sVar4 != 0) {
      lVar13 = 0;
      do {
        *(undefined8 *)(&pTVar12->state + lVar13) = *(undefined8 *)(&p->state + lVar13);
        puVar1 = (undefined8 *)((long)&(p->inputs)._M_len + lVar13);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pTVar12->inputs)._M_len + lVar13);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar13 = lVar13 + 0x18;
      } while (sVar4 * 0x18 != lVar13);
    }
  }
  else {
    for (; pTVar7 != pos; pTVar7 = pTVar7 + 1) {
      cVar9 = pTVar7->output;
      bVar10 = pTVar7->isEdgeSensitive;
      uVar11 = *(undefined5 *)&pTVar7->field_0x13;
      pTVar8->state = pTVar7->state;
      pTVar8->output = cVar9;
      pTVar8->isEdgeSensitive = bVar10;
      *(undefined5 *)&pTVar8->field_0x13 = uVar11;
      pcVar5 = (pTVar7->inputs)._M_str;
      (pTVar8->inputs)._M_len = (pTVar7->inputs)._M_len;
      (pTVar8->inputs)._M_str = pcVar5;
      pTVar8 = pTVar8 + 1;
    }
    memcpy((void *)((long)pTVar12 + lVar15 + 0x18),pos,((lVar13 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar14;
  this->data_ = pTVar12;
  return (pointer)((long)pTVar12 + lVar15);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}